

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-graph.hxx
# Opt level: O0

void __thiscall lineage::ProblemGraph::ProblemGraph(ProblemGraph *this,Problem *problem)

{
  Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *pGVar1;
  const_reference pvVar2;
  size_type sVar3;
  size_type sVar4;
  const_reference pvVar5;
  runtime_error *this_00;
  reference pvVar6;
  reference pvVar7;
  vector<lineage::Node,_std::allocator<lineage::Node>_> *in_RSI;
  undefined8 *in_RDI;
  value_type *edge;
  size_t j_1;
  value_type *node;
  size_t j;
  Visitor *in_stack_ffffffffffffff58;
  Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *in_stack_ffffffffffffff60;
  size_type in_stack_ffffffffffffff68;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *in_stack_ffffffffffffff70;
  undefined8 *vertexIndex1;
  ulong in_stack_ffffffffffffff80;
  Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *this_01;
  size_type local_40;
  size_t in_stack_ffffffffffffffc8;
  Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *in_stack_ffffffffffffffd0;
  Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *local_20;
  IdleGraphVisitor<unsigned_long> local_11;
  vector<lineage::Node,_std::allocator<lineage::Node>_> *local_10;
  
  *in_RDI = in_RSI;
  local_10 = in_RSI;
  andres::graph::IdleGraphVisitor<unsigned_long>::IdleGraphVisitor(&local_11);
  andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Graph
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)0x18845a);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)0x18846d);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)0x188480);
  local_20 = (Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)0x0;
  while( true ) {
    this_01 = local_20;
    pGVar1 = (Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)
             std::vector<lineage::Node,_std::allocator<lineage::Node>_>::size(local_10);
    if (pGVar1 <= this_01) break;
    pvVar2 = std::vector<lineage::Node,_std::allocator<lineage::Node>_>::operator[]
                       (local_10,(size_type)local_20);
    in_stack_ffffffffffffff80 = (ulong)pvVar2->t;
    sVar3 = std::
            vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ::size((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    *)(in_RDI + 0xe));
    if (sVar3 <= in_stack_ffffffffffffff80) {
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::resize(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    }
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  *)(in_RDI + 0xe),(long)pvVar2->t);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff60,
               (value_type_conflict *)in_stack_ffffffffffffff58);
    local_20 = (Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)
               ((long)&(local_20->vertices_).
                       super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1);
  }
  sVar3 = std::
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ::size((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  *)(in_RDI + 0xe));
  in_RDI[0x11] = sVar3;
  vertexIndex1 = in_RDI + 1;
  std::vector<lineage::Node,_std::allocator<lineage::Node>_>::size(local_10);
  andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::insertVertices
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  local_40 = 0;
  do {
    sVar3 = local_40;
    sVar4 = std::vector<lineage::Edge,_std::allocator<lineage::Edge>_>::size
                      ((vector<lineage::Edge,_std::allocator<lineage::Edge>_> *)(local_10 + 1));
    if (sVar4 <= sVar3) {
      return;
    }
    pvVar5 = std::vector<lineage::Edge,_std::allocator<lineage::Edge>_>::operator[]
                       ((vector<lineage::Edge,_std::allocator<lineage::Edge>_> *)(local_10 + 1),
                        local_40);
    if (pvVar5->t0 == pvVar5->t1) {
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    *)(in_RDI + 0xb),(long)pvVar5->t0);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff60,
                 (value_type_conflict *)in_stack_ffffffffffffff58);
    }
    else {
      if (pvVar5->t0 + 1 != pvVar5->t1) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"edge is not directed to next frame.");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    *)(in_RDI + 8),(long)pvVar5->t0);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff60,
                 (value_type_conflict *)in_stack_ffffffffffffff58);
    }
    in_stack_ffffffffffffff58 = (Visitor *)(in_RDI + 1);
    pvVar6 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           *)(in_RDI + 0xe),(long)pvVar5->t0);
    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (pvVar6,(long)pvVar5->v0);
    in_stack_ffffffffffffff60 = (Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)*pvVar7;
    pvVar6 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           *)(in_RDI + 0xe),(long)pvVar5->t1);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar6,(long)pvVar5->v1);
    andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::insertEdge
              (this_01,in_stack_ffffffffffffff80,(size_t)vertexIndex1);
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

ProblemGraph(Problem const& problem)
      : problem_(problem)
    {
        for (size_t j = 0; j < problem.nodes.size(); ++j) {
            auto const& node = problem.nodes[j];
            if (node.t >= nodeIndicesInFrame_.size())
                nodeIndicesInFrame_.resize(node.t + 1);

            nodeIndicesInFrame_[node.t].push_back(j);
        }

        numberOfFrames_ = nodeIndicesInFrame_.size();

        graph_.insertVertices(problem.nodes.size());

        edgeIndicesInFrame_.resize(numberOfFrames_);
        edgeIndicesFromFrame_.resize(numberOfFrames_ - 1);

        for (size_t j = 0; j < problem.edges.size(); ++j) {
            auto const& edge = problem.edges[j];

            if (edge.t0 == edge.t1)
                edgeIndicesInFrame_[edge.t0].push_back(j);
            else {
                if (edge.t0 + 1 != edge.t1)
                    throw std::runtime_error(
                        "edge is not directed to next frame.");

                edgeIndicesFromFrame_[edge.t0].push_back(j);
            }

            graph_.insertEdge(nodeIndicesInFrame_[edge.t0][edge.v0],
                              nodeIndicesInFrame_[edge.t1][edge.v1]);
        }
    }